

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O2

bool __thiscall glslang::TSymbolTable::isFunctionNameVariable(TSymbolTable *this,TString *name)

{
  bool bVar1;
  undefined8 in_RAX;
  long lVar2;
  bool variable;
  undefined8 uStack_28;
  
  if (this->separateNameSpaces == false) {
    lVar2 = (long)(int)((ulong)((long)(this->table).
                                      super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->table).
                                     super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1;
    uStack_28 = in_RAX;
    do {
      bVar1 = TSymbolTableLevel::findFunctionVariableName
                        ((this->table).
                         super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar2 + -2],name,
                         (bool *)((long)&uStack_28 + 7));
      if (bVar1) {
        goto LAB_0032b457;
      }
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
    uStack_28._7_1_ = 0;
  }
  else {
    uStack_28._7_1_ = 0;
  }
LAB_0032b457:
  return (bool)(uStack_28._7_1_ & 1);
}

Assistant:

bool isFunctionNameVariable(const TString& name) const
    {
        if (separateNameSpaces)
            return false;

        int level = currentLevel();
        do {
            bool variable;
            bool found = table[level]->findFunctionVariableName(name, variable);
            if (found)
                return variable;
            --level;
        } while (level >= 0);

        return false;
    }